

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,RealDescriptor *rd)

{
  istream *in_RDI;
  Vector<int,_std::allocator<int>_> ord;
  Vector<long,_std::allocator<long>_> fmt;
  char c;
  RealDescriptor *in_stack_ffffffffffffff28;
  RealDescriptor *in_stack_ffffffffffffff30;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  istream *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff7c;
  int *in_stack_ffffffffffffff80;
  Long *in_stack_ffffffffffffff88;
  RealDescriptor *in_stack_ffffffffffffff90;
  char local_29 [9];
  istream *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_20 = in_RDI;
  std::operator>>(in_RDI,local_29);
  if (local_29[0] != '(') {
    local_8 = "operator>>(istream&,RealDescriptor&): expected a \'(\'";
    Error_host((char *)in_stack_ffffffffffffff40);
  }
  Vector<long,_std::allocator<long>_>::Vector((Vector<long,_std::allocator<long>_> *)0x12416c7);
  getarray(in_stack_ffffffffffffff48,
           (Vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40);
  std::operator>>(local_20,local_29);
  if (local_29[0] != ',') {
    local_10 = "operator>>(istream&,RealDescriptor&): expected a \',\'";
    Error_host((char *)in_stack_ffffffffffffff40);
  }
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x1241749);
  getarray(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator>>(local_20,local_29);
  if (local_29[0] != ')') {
    local_18 = "operator>>(istream&,RealDescriptor&): expected a \')\'";
    Error_host((char *)in_stack_ffffffffffffff40);
  }
  Vector<long,_std::allocator<long>_>::dataPtr((Vector<long,_std::allocator<long>_> *)0x12417d3);
  Vector<int,_std::allocator<int>_>::dataPtr((Vector<int,_std::allocator<int>_> *)0x12417e7);
  Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x12417f6);
  RealDescriptor::RealDescriptor
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c);
  RealDescriptor::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  RealDescriptor::~RealDescriptor(in_stack_ffffffffffffff30);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1241841);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0x124184e);
  return local_20;
}

Assistant:

std::istream&
operator>> (std::istream&   is,
            RealDescriptor& rd)
{
    char c;
    is >> c;
    if (c != '(')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \'(\'");
    Vector<Long> fmt;
    getarray(is, fmt);
    is >> c;
    if (c != ',')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \',\'");
    Vector<int> ord;
    getarray(is, ord);
    is >> c;
    if (c != ')')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \')\'");
    rd = RealDescriptor(fmt.dataPtr(),ord.dataPtr(),ord.size());
    return is;
}